

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::Postprocess_BuildLight
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,
          list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  EType EVar5;
  ulong __n;
  aiLight *this_00;
  DeadlyImportError *this_01;
  float fVar6;
  float fVar7;
  float fVar8;
  aiLight *new_light;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  aiMatrix4x4 transform_matr;
  
  PostprocessHelper_Matrix_GlobalToCurrent(&transform_matr,this);
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  __n = (pNodeElement->ID)._M_string_length;
  new_light = this_00;
  if (__n < 0x400) {
    (this_00->mName).length = (ai_uint32)__n;
    memcpy((this_00->mName).data,(pNodeElement->ID)._M_dataplus._M_p,__n);
    (this_00->mName).data[__n] = '\0';
  }
  fVar1 = *(float *)&pNodeElement[1]._vptr_CX3DImporter_NodeElement;
  fVar2 = *(float *)((long)&pNodeElement[1]._vptr_CX3DImporter_NodeElement + 4);
  fVar7 = (float)*(undefined8 *)&pNodeElement[1].Type;
  fVar8 = (float)((ulong)*(undefined8 *)&pNodeElement[1].Type >> 0x20);
  (this_00->mColorAmbient).g = fVar1 * fVar7;
  (this_00->mColorAmbient).b = fVar1 * fVar8;
  fVar3 = *(float *)&pNodeElement[1].ID.field_2;
  fVar6 = fVar3 * fVar2;
  fVar7 = fVar3 * fVar7;
  fVar8 = fVar8 * fVar3;
  (this_00->mColorDiffuse).r = fVar6;
  (this_00->mColorDiffuse).g = fVar7;
  (this_00->mColorDiffuse).b = fVar8;
  (this_00->mColorSpecular).r = fVar6;
  (this_00->mColorSpecular).g = fVar7;
  (this_00->mColorSpecular).b = fVar8;
  (this_00->mColorAmbient).r = fVar2 * fVar1;
  EVar5 = pNodeElement->Type;
  if (EVar5 == ENET_SpotLight) {
    this_00->mType = aiLightSource_SPOT;
    *(CX3DImporter_NodeElement **)&this_00->mPosition = pNodeElement[1].Parent;
    (this_00->mPosition).z =
         *(float *)&pNodeElement[1].Child.
                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
    aiVector3t<float>::operator*=(&this_00->mPosition,&transform_matr);
    *(pointer *)&this_00->mDirection = pNodeElement[1].ID._M_dataplus._M_p;
    (this_00->mDirection).z = *(float *)&pNodeElement[1].ID._M_string_length;
    aiVector3t<float>::operator*=(&this_00->mDirection,&transform_matr);
    uVar4 = *(undefined8 *)((long)&pNodeElement[1].ID.field_2 + 4);
    this_00->mAttenuationConstant = (float)(int)uVar4;
    this_00->mAttenuationLinear = (float)(int)((ulong)uVar4 >> 0x20);
    this_00->mAttenuationQuadratic = *(float *)((long)&pNodeElement[1].ID.field_2 + 0xc);
    *(_List_node_base **)&this_00->mAngleInnerCone =
         pNodeElement[1].Child.
         super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
         _M_impl._M_node.super__List_node_base._M_prev;
  }
  else if (EVar5 == ENET_PointLight) {
    this_00->mType = aiLightSource_POINT;
    *(CX3DImporter_NodeElement **)&this_00->mPosition = pNodeElement[1].Parent;
    (this_00->mPosition).z =
         *(float *)&pNodeElement[1].Child.
                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
    aiVector3t<float>::operator*=(&this_00->mPosition,&transform_matr);
    uVar4 = *(undefined8 *)((long)&pNodeElement[1].ID.field_2 + 4);
    this_00->mAttenuationConstant = (float)(int)uVar4;
    this_00->mAttenuationLinear = (float)(int)((ulong)uVar4 >> 0x20);
    this_00->mAttenuationQuadratic = *(float *)((long)&pNodeElement[1].ID.field_2 + 0xc);
  }
  else {
    if (EVar5 != ENET_DirectionalLight) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<CX3DImporter_NodeElement::EType>(&local_c8,pNodeElement->Type);
      std::operator+(&local_a8,"Postprocess_BuildLight. Unknown type of light: ",&local_c8);
      std::operator+(&local_88,&local_a8,".");
      DeadlyImportError::DeadlyImportError(this_01,&local_88);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00->mType = aiLightSource_DIRECTIONAL;
    *(pointer *)&this_00->mDirection = pNodeElement[1].ID._M_dataplus._M_p;
    (this_00->mDirection).z = *(float *)&pNodeElement[1].ID._M_string_length;
    aiVector3t<float>::operator*=(&this_00->mDirection,&transform_matr);
  }
  std::__cxx11::list<aiLight_*,_std::allocator<aiLight_*>_>::push_back(pSceneLightList,&new_light);
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildLight(const CX3DImporter_NodeElement& pNodeElement, std::list<aiLight*>& pSceneLightList) const
{
    const CX3DImporter_NodeElement_Light& ne = *( ( CX3DImporter_NodeElement_Light* ) &pNodeElement );
    aiMatrix4x4 transform_matr = PostprocessHelper_Matrix_GlobalToCurrent();
    aiLight* new_light = new aiLight;

	new_light->mName = ne.ID;
	new_light->mColorAmbient = ne.Color * ne.AmbientIntensity;
	new_light->mColorDiffuse = ne.Color * ne.Intensity;
	new_light->mColorSpecular = ne.Color * ne.Intensity;
	switch(pNodeElement.Type)
	{
		case CX3DImporter_NodeElement::ENET_DirectionalLight:
			new_light->mType = aiLightSource_DIRECTIONAL;
			new_light->mDirection = ne.Direction, new_light->mDirection *= transform_matr;

			break;
		case CX3DImporter_NodeElement::ENET_PointLight:
			new_light->mType = aiLightSource_POINT;
			new_light->mPosition = ne.Location, new_light->mPosition *= transform_matr;
			new_light->mAttenuationConstant = ne.Attenuation.x;
			new_light->mAttenuationLinear = ne.Attenuation.y;
			new_light->mAttenuationQuadratic = ne.Attenuation.z;

			break;
		case CX3DImporter_NodeElement::ENET_SpotLight:
			new_light->mType = aiLightSource_SPOT;
			new_light->mPosition = ne.Location, new_light->mPosition *= transform_matr;
			new_light->mDirection = ne.Direction, new_light->mDirection *= transform_matr;
			new_light->mAttenuationConstant = ne.Attenuation.x;
			new_light->mAttenuationLinear = ne.Attenuation.y;
			new_light->mAttenuationQuadratic = ne.Attenuation.z;
			new_light->mAngleInnerCone = ne.BeamWidth;
			new_light->mAngleOuterCone = ne.CutOffAngle;

			break;
		default:
			throw DeadlyImportError("Postprocess_BuildLight. Unknown type of light: " + to_string(pNodeElement.Type) + ".");
	}

	pSceneLightList.push_back(new_light);
}